

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_3x3(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  memset(data,0,0x100);
  uVar4 = (ulong)start_col;
  for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 8) {
    lVar6 = *(long *)((long)sample_data + lVar8);
    bVar1 = *(byte *)(lVar6 + uVar4);
    bVar2 = *(byte *)(lVar6 + 2 + uVar4);
    iVar7 = (uint)bVar2 + (uint)bVar1;
    uVar5 = (uint)*(byte *)(lVar6 + 1 + uVar4);
    data[lVar8] = (iVar7 + uVar5) * 0x10 + -0x1800;
    data[lVar8 + 2] = (int)(iVar7 * 0x16a1 + uVar5 * -0x2d42 + 0x100) >> 9;
    data[lVar8 + 1] = (int)(((uint)bVar1 - (uint)bVar2) * 0x2731 + 0x100) >> 9;
  }
  for (lVar8 = 0; (int)lVar8 != 3; lVar8 = lVar8 + 1) {
    iVar7 = data[lVar8];
    iVar3 = data[lVar8 + 0x10];
    lVar6 = (long)(iVar3 + iVar7);
    data[lVar8] = (DCTELEM)((lVar6 + data[lVar8 + 8]) * 0x38e4 + 0x4000U >> 0xf);
    data[lVar8 + 0x10] = (DCTELEM)((lVar6 + (long)data[lVar8 + 8] * -2) * 0x283a + 0x4000U >> 0xf);
    data[lVar8 + 8] = (DCTELEM)((long)(iVar7 - iVar3) * 0x45ad + 0x4000U >> 0xf);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_3x3 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We scale the results further by 2**2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/6). */

  dataptr = data;
  for (ctr = 0; ctr < 3; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[2]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    tmp2 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 3 * CENTERJSAMPLE) << (PASS1_BITS+2));
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp1, FIX(0.707106781)), /* c2 */
	      CONST_BITS-PASS1_BITS-2);

    /* Odd part */

    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp2, FIX(1.224744871)),               /* c1 */
	      CONST_BITS-PASS1_BITS-2);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/3)**2 = 64/9, which we partially
   * fold into the constant multipliers (other part was done in pass 1):
   * cK now represents sqrt(2) * cos(K*pi/6) * 16/9.
   */

  dataptr = data;
  for (ctr = 0; ctr < 3; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*2];
    tmp1 = dataptr[DCTSIZE*1];

    tmp2 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),        /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp1, FIX(1.257078722)), /* c2 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp2, FIX(2.177324216)),               /* c1 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}